

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f3_get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  uint j_00;
  vrna_param_t *p;
  code *pcVar1;
  code *pcVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  void *pvVar10;
  int *piVar11;
  int local_bc;
  char *local_b8;
  uint local_ac;
  char **local_a8;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int maxdist;
  int *stems;
  int *c;
  int turn;
  int max_j;
  int j;
  int energy;
  uint length;
  uint type;
  uint n_seq;
  uint s;
  short *si;
  short **S;
  char **ptype;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  j_00 = fc->length;
  iVar8 = fc->window_size;
  p = fc->params;
  lVar9 = *(long *)((fc->matrices->field_2).field_0.c + (long)i * 2) + (long)i * -4;
  iVar6 = (p->model_details).min_loop_size;
  _n_seq = (void *)0x0;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_a8 = fc->ptype_local;
  }
  else {
    local_a8 = (char **)0x0;
  }
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_ac = 1;
  }
  else {
    local_ac = (fc->field_23).field_1.n_seq;
  }
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_b8 = (char *)0x0;
  }
  else {
    local_b8 = (fc->field_23).field_0.ptype_pf_compat;
  }
  pvVar10 = vrna_alloc((iVar8 + 6) * 4);
  piVar11 = (int *)((long)pvVar10 + (long)i * -4);
  pcVar1 = (code *)sc_wrapper->decomp_stem;
  pcVar2 = (code *)sc_wrapper->red_stem;
  if (j_00 - 1 < (uint)(i + iVar8)) {
    local_bc = j_00 - 1;
  }
  else {
    local_bc = i + iVar8;
  }
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    turn = i + iVar6;
    while (iVar5 = turn, turn = iVar5 + 1, turn <= local_bc) {
      piVar11[turn] = 10000000;
      if ((*(int *)(lVar9 + (long)turn * 4) != 10000000) &&
         (uVar3 = (*evaluate)(i,j_00,turn,iVar5 + 2,'\x10',hc_dat_local), uVar3 != '\0')) {
        uVar7 = vrna_get_ptype_window(i,turn,local_a8);
        iVar5 = *(int *)(lVar9 + (long)turn * 4);
        iVar4 = vrna_E_ext_stem(uVar7,-1,-1,p);
        piVar11[turn] = iVar5 + iVar4;
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    _n_seq = vrna_alloc(local_ac << 1);
    for (type = 0; type < local_ac; type = type + 1) {
      *(undefined2 *)((long)_n_seq + (ulong)type * 2) =
           *(undefined2 *)(*(long *)(local_b8 + (ulong)type * 8) + (long)i * 2);
    }
    turn = i + iVar6;
    while (iVar5 = turn, turn = iVar5 + 1, turn <= local_bc) {
      piVar11[turn] = 10000000;
      if ((*(int *)(lVar9 + (long)turn * 4) != 10000000) &&
         (uVar3 = (*evaluate)(i,j_00,turn,iVar5 + 2,'\x10',hc_dat_local), uVar3 != '\0')) {
        max_j = *(int *)(lVar9 + (long)turn * 4);
        for (type = 0; type < local_ac; type = type + 1) {
          uVar7 = vrna_get_ptype_md((int)*(short *)((long)_n_seq + (ulong)type * 2),
                                    (int)*(short *)(*(long *)(local_b8 + (ulong)type * 8) +
                                                   (long)turn * 2),&p->model_details);
          iVar5 = vrna_E_ext_stem(uVar7,-1,-1,p);
          max_j = iVar5 + max_j;
        }
        piVar11[turn] = max_j;
      }
    }
  }
  if (pcVar1 != (code *)0x0) {
    turn = i + iVar6;
    while (iVar6 = turn, turn = iVar6 + 1, turn <= local_bc) {
      if (piVar11[turn] != 10000000) {
        iVar6 = (*pcVar1)(i,turn,iVar6 + 2,sc_wrapper);
        piVar11[turn] = iVar6 + piVar11[turn];
      }
    }
  }
  if ((uint)(i + iVar8) < j_00) {
    piVar11[i + iVar8 + 1] = 10000000;
  }
  else {
    piVar11[(int)j_00] = 10000000;
    if ((*(int *)(lVar9 + (long)(int)j_00 * 4) != 10000000) &&
       (uVar3 = (*evaluate)(i,j_00,i,j_00,'\x0e',hc_dat_local), uVar3 != '\0')) {
      max_j = *(int *)(lVar9 + (long)(int)j_00 * 4);
      if (fc->type == VRNA_FC_TYPE_SINGLE) {
        uVar7 = vrna_get_ptype_window(i,j_00,local_a8);
        iVar8 = vrna_E_ext_stem(uVar7,-1,-1,p);
        max_j = iVar8 + max_j;
      }
      else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        for (type = 0; type < local_ac; type = type + 1) {
          uVar7 = vrna_get_ptype_md((int)*(short *)((long)_n_seq + (ulong)type * 2),
                                    (int)*(short *)(*(long *)(local_b8 + (ulong)type * 8) +
                                                   (long)(int)j_00 * 2),&p->model_details);
          iVar8 = vrna_E_ext_stem(uVar7,-1,-1,p);
          max_j = iVar8 + max_j;
        }
      }
      if (pcVar2 != (code *)0x0) {
        iVar8 = (*pcVar2)(i,i,j_00,sc_wrapper);
        max_j = iVar8 + max_j;
      }
      piVar11[(int)j_00] = max_j;
    }
  }
  free(_n_seq);
  return piVar11;
}

Assistant:

int *
f3_get_stem_contributions_d0(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   **S, *si;
  unsigned int            s, n_seq, type, length;
  int                     energy, j, max_j, turn, *c, *stems, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i];
  c       -= i;
  turn    = md->min_loop_size;
  si      = NULL;
  ptype   = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype_local : NULL;
  n_seq   = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S       = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  max_j = MIN2(length - 1, i + maxdist);

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j, ptype);
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      si = (short *)vrna_alloc(sizeof(short) * n_seq);

      for (s = 0; s < n_seq; s++)
        si[s] = S[s][i];

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }
          stems[j] = energy;
        }
      }
      break;
  }


  if (sc_spl_stem)
    for (j = i + turn + 1; j <= max_j; j++)
      if (stems[j] != INF)
        stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

  if (length <= i + maxdist) {
    j         = length;
    stems[j]  = INF;

    if ((c[j] != INF) &&
        (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
      energy = c[j];

      switch (fc->type) {
        case VRNA_FC_TYPE_SINGLE:
          type    = vrna_get_ptype_window(i, j, ptype);
          energy  += vrna_E_ext_stem(type, -1, -1, P);

          break;

        case VRNA_FC_TYPE_COMPARATIVE:
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }

          break;
      }

      if (sc_red_stem)
        energy += sc_red_stem(i, i, j, sc_wrapper);

      stems[j] = energy;
    }
  } else {
    /*
     * make sure we do not take (i + maxdist + 1) into account when
     * decomposing for odd dangle models
     */
    stems[i + maxdist + 1] = INF;
  }

  free(si);

  return stems;
}